

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O0

void __thiscall libDAI::JTree::JTree(JTree *this,FactorGraph *fg,Properties *opts,bool automatic)

{
  byte bVar1;
  undefined8 uVar2;
  long *plVar3;
  Exception *this_00;
  ulong uVar4;
  TFactor<double> *this_01;
  ulong uVar5;
  ostream *poVar6;
  VarSet *ns;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *this_02;
  size_type sVar7;
  byte in_CL;
  long *in_RDI;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *in_stack_00000058;
  JTree *in_stack_00000060;
  size_t i;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> ElimVec;
  ClusterGraph _cg;
  size_t I;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> cl;
  RegionGraph *in_stack_fffffffffffffb80;
  size_type sVar8;
  value_type *in_stack_fffffffffffffb88;
  ClusterGraph *in_stack_fffffffffffffb90;
  RegionGraph *in_stack_fffffffffffffb98;
  DAIAlg<libDAI::RegionGraph> *in_stack_fffffffffffffba0;
  allocator<char> *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbf0;
  size_t in_stack_fffffffffffffbf8;
  Exception *in_stack_fffffffffffffc00;
  size_type local_380;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *in_stack_fffffffffffffce8;
  ClusterGraph *in_stack_fffffffffffffcf0;
  pointer in_stack_fffffffffffffd28;
  ulong local_240;
  
  RegionGraph::RegionGraph
            ((RegionGraph *)in_stack_fffffffffffffba0,(FactorGraph *)in_stack_fffffffffffffb98);
  DAIAlg<libDAI::RegionGraph>::DAIAlg
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (Properties *)in_stack_fffffffffffffb90);
  RegionGraph::~RegionGraph(in_stack_fffffffffffffb80);
  *in_RDI = (long)&PTR_clone_00d4dba0;
  *(undefined1 (*) [16])(in_RDI + 0x3d) = (undefined1  [16])0x0;
  {unnamed_type#1}::JTree((anon_struct_16_2_712c85e1_for_Props *)0xb61e24);
  *(undefined1 (*) [16])(in_RDI + 0x3f) = (undefined1  [16])0x0;
  in_RDI[0x41] = 0;
  std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::vector
            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)0xb61e65);
  in_RDI[0x42] = 0;
  in_RDI[0x43] = 0;
  in_RDI[0x44] = 0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb61ea0)
  ;
  in_RDI[0x45] = 0;
  in_RDI[0x46] = 0;
  in_RDI[0x47] = 0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb61edb)
  ;
  in_RDI[0x48] = 0;
  in_RDI[0x49] = 0;
  in_RDI[0x4a] = 0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb61f16)
  ;
  in_RDI[0x4b] = 0;
  bVar1 = (**(code **)(*in_RDI + 0x88))();
  if ((bVar1 & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    Exception::Exception
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  plVar3 = (long *)(**(code **)(*in_RDI + 0x28))();
  bVar1 = (**(code **)(*plVar3 + 0x20))();
  if ((bVar1 & 1) == 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    Exception::Exception(this_00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  if ((in_CL & 1) != 0) {
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::vector
              ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)0xb621ee);
    local_240 = 0;
    while( true ) {
      uVar5 = local_240;
      plVar3 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar4 = (**(code **)(*plVar3 + 0x48))();
      if (uVar4 <= uVar5) break;
      plVar3 = (long *)(**(code **)(*in_RDI + 0x28))();
      this_01 = (TFactor<double> *)(**(code **)(*plVar3 + 0x50))(plVar3,local_240);
      TFactor<double>::vars(this_01);
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::push_back
                ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
                 in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      local_240 = local_240 + 1;
    }
    ClusterGraph::ClusterGraph(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    uVar5 = (**(code **)(*in_RDI + 0x30))();
    if (2 < uVar5) {
      std::operator<<((ostream *)&std::cout,"Initial clusters: ");
      poVar6 = libDAI::operator<<((ostream *)in_stack_fffffffffffffba0,
                                  (ClusterGraph *)in_stack_fffffffffffffb98);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    ClusterGraph::eraseNonMaximal(in_stack_fffffffffffffb90);
    uVar5 = (**(code **)(*in_RDI + 0x30))();
    if (2 < uVar5) {
      std::operator<<((ostream *)&std::cout,"Maximal clusters: ");
      in_stack_fffffffffffffba0 =
           (DAIAlg<libDAI::RegionGraph> *)
           libDAI::operator<<((ostream *)in_stack_fffffffffffffba0,
                              (ClusterGraph *)in_stack_fffffffffffffb98);
      std::ostream::operator<<(in_stack_fffffffffffffba0,std::endl<char,std::char_traits<char>>);
    }
    ClusterGraph::VarElim_MinFill((ClusterGraph *)in_stack_fffffffffffffd28);
    ns = (VarSet *)ClusterGraph::eraseNonMaximal(in_stack_fffffffffffffb90);
    ClusterGraph::toVector((ClusterGraph *)in_stack_fffffffffffffb88);
    ClusterGraph::~ClusterGraph((ClusterGraph *)0xb6243c);
    this_02 = (vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
              (**(code **)(*in_RDI + 0x30))();
    if ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)0x2 < this_02) {
      poVar6 = std::operator<<((ostream *)&std::cout,"VarElim_MinFill result: {");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      local_380 = 0;
      while( true ) {
        sVar8 = local_380;
        sVar7 = std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::size
                          ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
                           &stack0xfffffffffffffd18);
        if (sVar7 <= sVar8) break;
        if (local_380 != 0) {
          std::operator<<((ostream *)&std::cout,", ");
        }
        std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::operator[]
                  ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
                   &stack0xfffffffffffffd18,local_380);
        libDAI::operator<<((ostream *)in_stack_fffffffffffffba0,ns);
        local_380 = local_380 + 1;
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"}");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    GenerateJT(in_stack_00000060,in_stack_00000058);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(this_02);
    ClusterGraph::~ClusterGraph((ClusterGraph *)0xb625d4);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(this_02);
  }
  return;
}

Assistant:

JTree::JTree( const FactorGraph &fg, const Properties &opts, bool automatic ) : DAIAlgRG(fg, opts), Props(), _RTree(), _Qa(), _Qb(), _mes(), _logZ() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        if( !grm().isConnected() ) 
           DAI_THROW(FACTORGRAPH_NOT_CONNECTED); 

        if( automatic ) {
            // Create ClusterGraph which contains factors as clusters
            vector<VarSet> cl;
            for( size_t I = 0; I < grm().nrFactors(); I++ )
                cl.push_back( grm().factor(I).vars() );
            ClusterGraph _cg(cl);

            if( Verbose() >= 3 ) {
                cout << "Initial clusters: " << _cg << endl;
            }

            // Retain only maximal clusters
            _cg.eraseNonMaximal();
            if( Verbose() >= 3 )
                cout << "Maximal clusters: " << _cg << endl;

            vector<VarSet> ElimVec = _cg.VarElim_MinFill().eraseNonMaximal().toVector();
            if( Verbose() >= 3 ) {
                cout << "VarElim_MinFill result: {" << endl;
                for( size_t i = 0; i < ElimVec.size(); i++ ) {
                    if( i != 0 )
                        cout << ", ";
                    cout << ElimVec[i];
                }
                cout << "}" << endl;
            }

            GenerateJT( ElimVec );
        }
    }